

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O2

void __thiscall JPG::quantization(JPG *this)

{
  uint uVar1;
  MCU *pMVar2;
  Block *paiVar3;
  uint uVar4;
  Block **ppaiVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint componentID;
  uint ID;
  long lVar9;
  int *piVar10;
  uint ii;
  uint uVar11;
  uint jj;
  uint uVar12;
  
  for (uVar7 = 0; uVar7 < this->mcuHeight; uVar7 = uVar7 + 1) {
    uVar8 = 0;
    while( true ) {
      uVar1 = this->mcuWidth;
      if (uVar1 <= uVar8) break;
      pMVar2 = this->data;
      for (ID = 1; ID != 4; ID = ID + 1) {
        piVar10 = QUANTIZATION_TABLE_CBCR;
        if (ID == 1) {
          piVar10 = QUANTIZATION_TABLE_Y;
        }
        uVar11 = 0;
        while( true ) {
          uVar4 = getVerticalSamplingFrequency(this,ID);
          if (uVar4 <= uVar11) break;
          uVar12 = 0;
          while( true ) {
            uVar4 = getHorizontalSamplingFrequency(this,ID);
            if (uVar4 <= uVar12) break;
            ppaiVar5 = MCU::operator[](pMVar2 + (uVar1 * uVar7 + uVar8),ID);
            paiVar3 = *ppaiVar5;
            uVar4 = getHorizontalSamplingFrequency(this,ID);
            uVar6 = uVar4 * uVar11 + uVar12;
            for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 1) {
              paiVar3[uVar6][lVar9] = paiVar3[uVar6][lVar9] / piVar10[lVar9];
            }
            uVar12 = uVar12 + 1;
          }
          uVar11 = uVar11 + 1;
        }
      }
      uVar8 = uVar8 + 1;
    }
  }
  return;
}

Assistant:

void JPG::quantization() {
    for (uint i = 0; i < mcuHeight; i++) {
        for (uint j = 0; j < mcuWidth; j++) {
            MCU& currentMCU = data[i * mcuWidth + j];
            //iterate over 每一个component Y, cb cr
            for (uint componentID = 1; componentID <= 3; componentID++) {
                //遍历block
                for(uint ii = 0; ii < getVerticalSamplingFrequency(componentID); ii++) {
                    for(uint jj = 0; jj < getHorizontalSamplingFrequency(componentID); jj++) {
                        Block& currentBlock = currentMCU[componentID][ii * getHorizontalSamplingFrequency(componentID) + jj];
                        const Block& quantizationTable = JPG::getQuantizationTableByID(componentID);

                        for(uint index = 0; index < 64; index++) {
                             currentBlock[index] = currentBlock[index] / quantizationTable[index];
                        }
                    }
                }             
            }
        }
    }  
}